

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::PushEvalStack(WasmBytecodeGenerator *this,PolymorphicEmitInfo info)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  EmitInfo local_2c;
  uint local_24;
  WasmBytecodeGenerator *pWStack_20;
  uint32 i;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo info_local;
  
  info_local._0_8_ = info.field_1;
  this_local._0_4_ = info.count;
  pWStack_20 = this;
  bVar3 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Empty
                    (&this->m_evalStack);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x82f,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  for (local_24 = 0; uVar2 = local_24,
      uVar4 = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&this_local), uVar2 < uVar4;
      local_24 = local_24 + 1) {
    local_2c = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&this_local,local_24);
    JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Push
              (&this->m_evalStack,&local_2c);
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::PushEvalStack(PolymorphicEmitInfo info)
{
    Assert(!m_evalStack.Empty());
    for (uint32 i = 0; i < info.Count(); ++i)
    {
        m_evalStack.Push(info.GetInfo(i));
    }
}